

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  int iVar1;
  secp256k1_fe *in_RSI;
  secp256k1_fe t;
  secp256k1_fe r;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  secp256k1_fe *in_stack_ffffffffffffff90;
  
  iVar1 = secp256k1_fe_normalizes_to_zero_var((secp256k1_fe *)0x13ca68);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/group_impl.h"
            ,0x3c2,"test condition failed: !secp256k1_fe_normalizes_to_zero_var(xd)");
    abort();
  }
  secp256k1_fe_mul(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (secp256k1_fe *)0x13cac7);
  secp256k1_fe_sqr(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  secp256k1_fe_mul(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (secp256k1_fe *)0x13cae8);
  secp256k1_fe_sqr(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  secp256k1_fe_sqr(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  secp256k1_fe_mul_int_unchecked(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  secp256k1_fe_add(in_stack_ffffffffffffff90,
                   (secp256k1_fe *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  iVar1 = secp256k1_fe_is_square_var(in_RSI);
  return iVar1;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}